

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatChains.cpp
# Opt level: O2

void __thiscall FatChains::chainsAnalysis(FatChains *this)

{
  ostream *poVar1;
  list<FatChain,_std::allocator<FatChain>_> orphanedChains;
  map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> chains;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  _List_base<FatChain,_std::allocator<FatChain>_> local_a0;
  _List_base<FatChain,_std::allocator<FatChain>_> local_88;
  _Rb_tree<int,_std::pair<const_int,_FatChain>,_std::_Select1st<std::pair<const_int,_FatChain>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
  local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  FatSystem::enableCache((this->super_FatModule).system);
  poVar1 = std::operator<<((ostream *)&std::cout,"Building the chains...");
  std::endl<char,std::char_traits<char>>(poVar1);
  findChains((map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )&local_70,this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Found ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," chains");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running the recursive differential analysis...");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->saveEntries = false;
  this->exploreDamaged = false;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  recursiveExploration
            (this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                   *)&local_70,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_40,
             (int)((this->super_FatModule).system)->rootDirectory,
             (vector<FatEntry,_std::allocator<FatEntry>_> *)0x0);
  local_a0._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_40,(int *)&local_a0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Having a look at the chains...");
  std::endl<char,std::char_traits<char>>(poVar1);
  this->saveEntries = true;
  exploreChains(this,(map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
                      *)&local_70,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_40);
  getOrphaned_abi_cxx11_
            ((list<FatChain,_std::allocator<FatChain>_> *)&local_a0,this,
             (map<int,_FatChain,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_> *
             )&local_70);
  std::__cxx11::list<FatChain,_std::allocator<FatChain>_>::list
            ((list<FatChain,_std::allocator<FatChain>_> *)&local_88,
             (list<FatChain,_std::allocator<FatChain>_> *)&local_a0);
  displayOrphaned(this,(list<FatChain,_std::allocator<FatChain>_> *)&local_88);
  std::__cxx11::_List_base<FatChain,_std::allocator<FatChain>_>::_M_clear(&local_88);
  std::__cxx11::_List_base<FatChain,_std::allocator<FatChain>_>::_M_clear(&local_a0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_40);
  std::
  _Rb_tree<int,_std::pair<const_int,_FatChain>,_std::_Select1st<std::pair<const_int,_FatChain>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatChain>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

void FatChains::chainsAnalysis()
{
    system.enableCache();

    cout << "Building the chains..." << endl;
    map<int, FatChain> chains = findChains();

    /*
    map<int, FatChain>::iterator mit;
    for (mit=chains.begin(); mit!=chains.end(); mit++) {
        cout << mit->first << "~>" << mit->second.endCluster << endl;
    } 
    */

    cout << "Found " << chains.size() << " chains" << endl;
    cout << endl;

    cout << "Running the recursive differential analysis..." << endl;
    set<int> visited;
    saveEntries = false;
    exploreDamaged = false;
    recursiveExploration(chains, visited, system.rootDirectory);
    visited.insert(0);
    cout << endl;

    cout << "Having a look at the chains..." << endl;
    saveEntries = true;
    exploreChains(chains, visited);
   
    // Getting orphaned elements from the map
    list<FatChain> orphanedChains = getOrphaned(chains);
    displayOrphaned(orphanedChains);
}